

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_command.cpp
# Opt level: O0

UniValue * RunCommandParseJSON(string *str_command,string *str_std_in)

{
  bool bVar1;
  int iVar2;
  runtime_error *prVar3;
  ulong uVar4;
  undefined1 *__n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__nbytes;
  int in_EDX;
  void *__buf;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_RSI;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  __sv_type _Var5;
  type *err_res;
  type *out_res;
  int n_error;
  string error;
  string result;
  Popen c;
  istringstream stderr_stream;
  istringstream stdout_stream;
  UniValue result_json;
  Popen *in_stack_fffffffffffff9a8;
  Popen *in_stack_fffffffffffff9b0;
  undefined4 in_stack_fffffffffffff9b8;
  IOTYPE in_stack_fffffffffffff9bc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9c0;
  UniValue *in_stack_fffffffffffff9c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2;
  int *args_1;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> __end;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9f0;
  UniValue *__lhs;
  undefined7 in_stack_fffffffffffffa08;
  undefined1 in_stack_fffffffffffffa0f;
  undefined1 in_stack_fffffffffffffa10 [16];
  undefined7 in_stack_fffffffffffffa20;
  undefined1 in_stack_fffffffffffffa27;
  Popen *in_stack_fffffffffffffa28;
  undefined1 local_57a [2];
  int local_578 [17];
  undefined1 local_534 [12];
  undefined1 local_528 [16];
  string local_518 [32];
  string local_4f8 [32];
  string local_4d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8 [3];
  Popen local_458;
  istringstream local_360 [384];
  istringstream local_1e0 [384];
  UniValue local_60;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __lhs = in_RDI;
  UniValue::UniValue((UniValue *)in_stack_fffffffffffff9a8);
  std::__cxx11::istringstream::istringstream(local_1e0);
  std::__cxx11::istringstream::istringstream(local_360);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff9a8);
  if (bVar1) {
    std::__cxx11::string::string(in_stack_fffffffffffff9c0);
    UniValue::UniValue(in_stack_fffffffffffff9c8,(VType)((ulong)in_stack_fffffffffffff9c0 >> 0x20),
                       (string *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff9a8);
  }
  else {
    subprocess::input::input((input *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9bc);
    subprocess::output::output((output *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9bc);
    subprocess::error::error((error *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9bc);
    __n = local_528;
    iVar2 = (int)local_534;
    subprocess::Popen::Popen<subprocess::input,subprocess::output,subprocess::error>
              (in_stack_fffffffffffffa28,
               (string *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
               in_stack_fffffffffffffa10._8_8_,in_stack_fffffffffffffa10._0_8_,
               (error *)CONCAT17(in_stack_fffffffffffffa0f,in_stack_fffffffffffffa08));
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff9a8);
    if (!bVar1) {
      subprocess::Popen::send(&local_458,in_EDX,__buf,(size_t)__n,iVar2);
    }
    subprocess::Popen::communicate(in_stack_fffffffffffff9b0);
    args_1 = local_578;
    std::get<0ul,subprocess::Buffer,subprocess::Buffer>
              ((pair<subprocess::Buffer,_subprocess::Buffer> *)in_stack_fffffffffffff9a8);
    std::get<1ul,subprocess::Buffer,subprocess::Buffer>
              ((pair<subprocess::Buffer,_subprocess::Buffer> *)in_stack_fffffffffffff9a8);
    std::vector<char,_std::allocator<char>_>::begin
              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff9b0);
    std::vector<char,_std::allocator<char>_>::end
              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff9b0);
    __end._M_current = local_57a + 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::
    string<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff9c8,in_RSI,__end,(allocator<char> *)in_stack_fffffffffffff9c0);
    std::__cxx11::istringstream::str((string *)local_1e0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff9a8);
    std::allocator<char>::~allocator((allocator<char> *)(local_57a + 1));
    std::vector<char,_std::allocator<char>_>::begin
              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff9b0);
    std::vector<char,_std::allocator<char>_>::end
              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff9b0);
    __nbytes = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_57a;
    std::allocator<char>::allocator();
    args_2 = __nbytes;
    std::__cxx11::string::
    string<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff9c8,in_RSI,__end,(allocator<char> *)in_stack_fffffffffffff9c0);
    std::__cxx11::istringstream::str((string *)local_360);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff9a8);
    std::allocator<char>::~allocator((allocator<char> *)local_57a);
    this = local_4b8;
    std::__cxx11::string::string(in_stack_fffffffffffff9c0);
    std::__cxx11::string::string(in_stack_fffffffffffff9c0);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_1e0,(string *)this);
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_360,local_4d8);
    iVar2 = subprocess::Popen::retcode(in_stack_fffffffffffff9a8);
    if (iVar2 != 0) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      tinyformat::format<std::__cxx11::string,int,std::__cxx11::string>
                (in_RSI._M_current,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __end._M_current,args_1,args_2);
      std::runtime_error::runtime_error(prVar3,local_4f8);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00817837;
    }
    _Var5 = std::__cxx11::string::operator_cast_to_basic_string_view(this);
    uVar4 = UniValue::read(&local_60,(int)_Var5._M_len,_Var5._M_str,(size_t)__nbytes);
    if ((uVar4 & 1) == 0) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+((char *)__lhs,in_stack_fffffffffffff9f0);
      std::runtime_error::runtime_error(prVar3,local_518);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00817837;
    }
    UniValue::UniValue((UniValue *)
                       CONCAT44(CONCAT13((char)uVar4,(int3)in_stack_fffffffffffff9bc),
                                in_stack_fffffffffffff9b8),(UniValue *)in_stack_fffffffffffff9b0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff9a8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff9a8);
    std::pair<subprocess::Buffer,_subprocess::Buffer>::~pair
              ((pair<subprocess::Buffer,_subprocess::Buffer> *)in_stack_fffffffffffff9a8);
    subprocess::Popen::~Popen(in_stack_fffffffffffff9a8);
  }
  std::__cxx11::istringstream::~istringstream(local_360);
  std::__cxx11::istringstream::~istringstream(local_1e0);
  UniValue::~UniValue((UniValue *)in_stack_fffffffffffff9a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
LAB_00817837:
  __stack_chk_fail();
}

Assistant:

UniValue RunCommandParseJSON(const std::string& str_command, const std::string& str_std_in)
{
#ifdef ENABLE_EXTERNAL_SIGNER
    namespace sp = subprocess;

    UniValue result_json;
    std::istringstream stdout_stream;
    std::istringstream stderr_stream;

    if (str_command.empty()) return UniValue::VNULL;

    auto c = sp::Popen(str_command, sp::input{sp::PIPE}, sp::output{sp::PIPE}, sp::error{sp::PIPE});
    if (!str_std_in.empty()) {
        c.send(str_std_in);
    }
    auto [out_res, err_res] = c.communicate();
    stdout_stream.str(std::string{out_res.buf.begin(), out_res.buf.end()});
    stderr_stream.str(std::string{err_res.buf.begin(), err_res.buf.end()});

    std::string result;
    std::string error;
    std::getline(stdout_stream, result);
    std::getline(stderr_stream, error);

    const int n_error = c.retcode();
    if (n_error) throw std::runtime_error(strprintf("RunCommandParseJSON error: process(%s) returned %d: %s\n", str_command, n_error, error));
    if (!result_json.read(result)) throw std::runtime_error("Unable to parse JSON: " + result);

    return result_json;
#else
    throw std::runtime_error("Compiled without external signing support (required for external signing).");
#endif // ENABLE_EXTERNAL_SIGNER
}